

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

pin_t __thiscall
lsim::Simulator::assign_pin(Simulator *this,SimComponent *component,bool used_as_input)

{
  iterator iVar1;
  iterator __position;
  pointer pNVar2;
  uint uVar3;
  node_t node_id;
  pin_t result;
  node_t local_1c;
  Value local_18;
  uint local_14;
  
  uVar3 = (uint)((ulong)((long)(this->m_pin_nodes).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_pin_nodes).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_14 = uVar3;
  local_1c = assign_node(this,component,used_as_input);
  iVar1._M_current =
       (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_pin_nodes,iVar1,
               &local_1c);
  }
  else {
    *iVar1._M_current = local_1c;
    (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_18 = VALUE_UNDEFINED;
  __position._M_current =
       (this->m_pin_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_pin_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<lsim::Value,_std::allocator<lsim::Value>_>::_M_realloc_insert<lsim::Value>
              (&this->m_pin_values,__position,&local_18);
  }
  else {
    *__position._M_current = VALUE_UNDEFINED;
    (this->m_pin_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  pNVar2 = (this->m_node_metadata).
           super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1._M_current =
       *(pointer *)
        ((long)&pNVar2[local_1c].m_pins.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8);
  if (iVar1._M_current ==
      *(pointer *)
       ((long)&pNVar2[local_1c].m_pins.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 0x10)) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pNVar2[local_1c].m_pins,iVar1,
               &local_14);
  }
  else {
    *iVar1._M_current = uVar3;
    *(uint **)((long)&pNVar2[local_1c].m_pins.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) =
         iVar1._M_current + 1;
    local_14 = uVar3;
  }
  return local_14;
}

Assistant:

pin_t Simulator::assign_pin(SimComponent *component, bool used_as_input) {
    auto result = static_cast<pin_t>(m_pin_nodes.size());
	auto node_id = assign_node(component, used_as_input);
	m_pin_nodes.push_back(node_id);
    m_pin_values.push_back(VALUE_UNDEFINED);
	m_node_metadata[node_id].m_pins.push_back(result);
    return result;
}